

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int *in_RCX;
  secp256k1_modinv32_signed30 *in_RDX;
  long lVar11;
  int *in_RSI;
  secp256k1_modinv32_signed30 *in_RDI;
  int i;
  int64_t ce;
  int64_t cd;
  int32_t se;
  int32_t sd;
  int32_t me;
  int32_t md;
  int32_t ei;
  int32_t di;
  int32_t r;
  int32_t q;
  int32_t v;
  int32_t u;
  int32_t M30;
  int local_64;
  long local_60;
  long local_58;
  int32_t factor;
  
  uVar1 = in_RDX->v[0];
  uVar2 = in_RDX->v[1];
  uVar3 = in_RDX->v[2];
  uVar4 = in_RDX->v[3];
  factor = (int32_t)((ulong)in_RCX >> 0x20);
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,factor);
  if (iVar5 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x19e,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,factor);
  if (-1 < iVar5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x19f,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0");
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,factor);
  if (iVar5 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1a0,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,factor);
  if (-1 < iVar5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1a1,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0");
    abort();
  }
  lVar8 = (long)(int)uVar1;
  if (lVar8 < 1) {
    lVar8 = -lVar8;
  }
  lVar11 = (long)(int)uVar2;
  if (lVar11 < 1) {
    lVar11 = -lVar11;
  }
  if (0x40000000 - lVar11 < lVar8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1a2,"test condition failed: labs(u) <= (M30 + 1 - labs(v))");
    abort();
  }
  lVar8 = (long)(int)uVar3;
  if (lVar8 < 1) {
    lVar8 = -lVar8;
  }
  lVar11 = (long)(int)uVar4;
  if (lVar11 < 1) {
    lVar11 = -lVar11;
  }
  if (0x40000000 - lVar11 < lVar8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1a3,"test condition failed: labs(q) <= (M30 + 1 - labs(r))");
    abort();
  }
  uVar6 = in_RDI->v[8] >> 0x1f;
  iVar5 = (uVar1 & uVar6) + (uVar2 & in_RSI[8] >> 0x1f);
  iVar7 = (uVar3 & uVar6) + (uVar4 & in_RSI[8] >> 0x1f);
  lVar8 = (long)(int)uVar1 * (long)in_RDI->v[0] + (long)(int)uVar2 * (long)*in_RSI;
  lVar11 = (long)(int)uVar3 * (long)in_RDI->v[0] + (long)(int)uVar4 * (long)*in_RSI;
  iVar5 = iVar5 - (in_RCX[9] * (int)lVar8 + iVar5 & 0x3fffffffU);
  iVar7 = iVar7 - (in_RCX[9] * (int)lVar11 + iVar7 & 0x3fffffffU);
  uVar9 = (long)*in_RCX * (long)iVar5 + lVar8;
  uVar10 = (long)*in_RCX * (long)iVar7 + lVar11;
  if ((uVar9 & 0x3fffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1b6,"test condition failed: ((int32_t)cd & M30) == 0");
    abort();
  }
  if ((uVar10 & 0x3fffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1b7,"test condition failed: ((int32_t)ce & M30) == 0");
    abort();
  }
  for (local_64 = 1; local_58 = (long)uVar9 >> 0x1e, local_60 = (long)uVar10 >> 0x1e, local_64 < 9;
      local_64 = local_64 + 1) {
    uVar9 = (long)in_RCX[local_64] * (long)iVar5 +
            (long)(int)uVar1 * (long)in_RDI->v[local_64] + (long)(int)uVar2 * (long)in_RSI[local_64]
            + local_58;
    uVar10 = (long)in_RCX[local_64] * (long)iVar7 +
             (long)(int)uVar3 * (long)in_RDI->v[local_64] +
             (long)(int)uVar4 * (long)in_RSI[local_64] + local_60;
    in_RDI->v[local_64 + -1] = (uint)uVar9 & 0x3fffffff;
    in_RSI[local_64 + -1] = (uint)uVar10 & 0x3fffffff;
  }
  in_RDI->v[8] = (int32_t)local_58;
  in_RSI[8] = (int)local_60;
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,factor);
  iVar7 = (int)((ulong)in_RSI >> 0x20);
  if (iVar5 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1c8,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,iVar7,in_RDX,factor);
  if (-1 < iVar5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1c9,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0");
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,iVar7,in_RDX,factor);
  if (iVar5 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1ca,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar5 = secp256k1_modinv32_mul_cmp_30(in_RDI,iVar7,in_RDX,factor);
  if (-1 < iVar5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x1cb,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0");
    abort();
  }
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}